

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.h
# Opt level: O0

void absl::lts_20240722::strings_internal::Base64EscapeInternal<std::__cxx11::string>
               (uchar *src,size_t szsrc,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dest,
               bool do_padding,char *base64_chars)

{
  size_t new_size;
  char *pcVar1;
  ulong uVar2;
  size_t escaped_len;
  size_t calc_escaped_size;
  char *base64_chars_local;
  bool do_padding_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dest_local;
  size_t szsrc_local;
  uchar *src_local;
  
  new_size = absl::lts_20240722::strings_internal::CalculateBase64EscapedLenInternal
                       (szsrc,do_padding);
  STLStringResizeUninitialized<std::__cxx11::string,void>(dest,new_size);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)dest);
  uVar2 = std::__cxx11::string::size();
  uVar2 = absl::lts_20240722::strings_internal::Base64EscapeInternal
                    (src,szsrc,pcVar1,uVar2,base64_chars,do_padding);
  if (new_size == uVar2) {
    std::__cxx11::string::erase((ulong)dest,uVar2);
    return;
  }
  __assert_fail("calc_escaped_size == escaped_len",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/strings/internal/escaping.h"
                ,0x31,
                "void absl::strings_internal::Base64EscapeInternal(const unsigned char *, size_t, String *, bool, const char *) [String = std::basic_string<char>]"
               );
}

Assistant:

void Base64EscapeInternal(const unsigned char* src, size_t szsrc, String* dest,
                          bool do_padding, const char* base64_chars) {
  const size_t calc_escaped_size =
      CalculateBase64EscapedLenInternal(szsrc, do_padding);
  STLStringResizeUninitialized(dest, calc_escaped_size);

  const size_t escaped_len = Base64EscapeInternal(
      src, szsrc, &(*dest)[0], dest->size(), base64_chars, do_padding);
  assert(calc_escaped_size == escaped_len);
  dest->erase(escaped_len);
}